

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O0

void h264_print_ref_pic_list_modification(h264_ref_pic_list_modification *list,char *which)

{
  uint uVar1;
  int local_1c;
  int op;
  int i;
  char *which_local;
  h264_ref_pic_list_modification *list_local;
  
  printf("\tref_pic_list_modification_flag_%s = %d\n",which,(ulong)list->flag);
  local_1c = 0;
  while (list->list[local_1c].op != 3) {
    uVar1 = list->list[local_1c].op;
    printf("\tmodification_of_pic_nums_idc = %d [%s]\n",(ulong)uVar1,
           h264_print_ref_pic_list_modification::opnames[(int)uVar1]);
    printf("\t%s = %d\n",h264_print_ref_pic_list_modification::argnames[(int)uVar1],
           (ulong)list->list[local_1c].param);
    local_1c = local_1c + 1;
  }
  printf("\tmodification_of_pic_nums_idc = 3 [END]\n");
  return;
}

Assistant:

void h264_print_ref_pic_list_modification(struct h264_ref_pic_list_modification *list, char *which) {
	static const char *const opnames[6] = { "pic_num sub", "pic_num add", "long term", "end", "view idx sub", "view idx add" };
	static const char *const argnames[6] = { "abs_diff_pic_num_minus1", "abs_diff_pic_num_minus1", "long_term_pic_num", 0, "abs_diff_view_idx_minus1", "abs_diff_view_idx_minus1" };
	int i;
	printf("\tref_pic_list_modification_flag_%s = %d\n", which, list->flag);
	for (i = 0; list->list[i].op != 3; i++) {
		int op = list->list[i].op;
		printf("\tmodification_of_pic_nums_idc = %d [%s]\n", op, opnames[op]);
		printf("\t%s = %d\n", argnames[op], list->list[i].param);
	}
	printf("\tmodification_of_pic_nums_idc = 3 [END]\n");
}